

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O0

lrtr_ipv6_addr lrtr_ipv6_get_bits(lrtr_ipv6_addr *val,uint8_t first_bit,uint8_t quantity)

{
  byte bVar1;
  uint8_t uVar2;
  long in_FS_OFFSET;
  lrtr_ipv6_addr lVar3;
  byte local_2b;
  uint8_t q_3;
  uint8_t fr_2;
  uint8_t q_2;
  uint8_t fr_1;
  uint8_t q_1;
  uint8_t fr;
  uint8_t q;
  uint8_t bits_left;
  uint8_t quantity_local;
  uint8_t first_bit_local;
  lrtr_ipv6_addr *val_local;
  lrtr_ipv6_addr result;
  
  result.addr._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if (0x7f < first_bit) {
    __assert_fail("first_bit <= 127",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                  ,0x20,
                  "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                 );
  }
  if (0x80 < quantity) {
    __assert_fail("quantity <= 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                  ,0x21,
                  "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                 );
  }
  if (0x80 < (uint)first_bit + (uint)quantity) {
    __assert_fail("first_bit + quantity <= 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                  ,0x22,
                  "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                 );
  }
  memset(&val_local,0,0x10);
  local_2b = quantity;
  if (first_bit < 0x20) {
    bVar1 = quantity;
    if (0x20 < quantity) {
      bVar1 = 0x20;
    }
    if (quantity < bVar1) {
      __assert_fail("bits_left >= q",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                    ,0x2e,
                    "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                   );
    }
    local_2b = quantity - bVar1;
    val_local._0_4_ = lrtr_get_bits(val->addr[0],first_bit,bVar1);
  }
  if ((first_bit < 0x40) && (0x20 < (uint)first_bit + (uint)quantity)) {
    if (first_bit < 0x20) {
      uVar2 = '\0';
    }
    else {
      uVar2 = first_bit + 0xe0;
    }
    bVar1 = local_2b;
    if (0x20 < local_2b) {
      bVar1 = 0x20;
    }
    if (local_2b < bVar1) {
      __assert_fail("bits_left >= q",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                    ,0x37,
                    "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                   );
    }
    local_2b = local_2b - bVar1;
    val_local._4_4_ = lrtr_get_bits(val->addr[1],uVar2,bVar1);
  }
  if ((first_bit < 0x60) && (0x40 < (uint)first_bit + (uint)quantity)) {
    if (first_bit < 0x40) {
      uVar2 = '\0';
    }
    else {
      uVar2 = first_bit + 0xc0;
    }
    bVar1 = local_2b;
    if (0x20 < local_2b) {
      bVar1 = 0x20;
    }
    if (local_2b < bVar1) {
      __assert_fail("bits_left >= q",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                    ,0x40,
                    "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                   );
    }
    local_2b = local_2b - bVar1;
    result.addr[0] = lrtr_get_bits(val->addr[2],uVar2,bVar1);
  }
  if ((first_bit < 0x80) && (0x60 < (uint)first_bit + (uint)quantity)) {
    if (first_bit < 0x60) {
      uVar2 = '\0';
    }
    else {
      uVar2 = first_bit + 0xa0;
    }
    bVar1 = local_2b;
    if (0x20 < local_2b) {
      bVar1 = 0x20;
    }
    if (local_2b < bVar1) {
      __assert_fail("bits_left >= q",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                    ,0x49,
                    "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                   );
    }
    result.addr[1] = lrtr_get_bits(val->addr[3],uVar2,bVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != result.addr._8_8_) {
    __stack_chk_fail();
  }
  lVar3.addr[0] = (uint32_t)val_local;
  lVar3.addr[1] = val_local._4_4_;
  lVar3.addr[2] = result.addr[0];
  lVar3.addr[3] = result.addr[1];
  return (lrtr_ipv6_addr)lVar3.addr;
}

Assistant:

struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *val, const uint8_t first_bit,
					 const uint8_t quantity)
{
	assert(first_bit <= 127);
	assert(quantity <= 128);
	assert(first_bit + quantity <= 128);

	// if no bytes get extracted the result has to be 0
	struct lrtr_ipv6_addr result;

	memset(&result, 0, sizeof(result));

	uint8_t bits_left = quantity;

	if (first_bit <= 31) {
		const uint8_t q = quantity > 32 ? 32 : quantity;

		assert(bits_left >= q);
		bits_left -= q;
		result.addr[0] = lrtr_get_bits(val->addr[0], first_bit, q);
	}

	if ((first_bit <= 63) && ((first_bit + quantity) > 32)) {
		const uint8_t fr = first_bit < 32 ? 0 : first_bit - 32;
		const uint8_t q = bits_left > 32 ? 32 : bits_left;

		assert(bits_left >= q);
		bits_left -= q;
		result.addr[1] = lrtr_get_bits(val->addr[1], fr, q);
	}

	if ((first_bit <= 95) && ((first_bit + quantity) > 64)) {
		const uint8_t fr = first_bit < 64 ? 0 : first_bit - 64;
		const uint8_t q = bits_left > 32 ? 32 : bits_left;

		assert(bits_left >= q);
		bits_left -= q;
		result.addr[2] = lrtr_get_bits(val->addr[2], fr, q);
	}

	if ((first_bit <= 127) && ((first_bit + quantity) > 96)) {
		const uint8_t fr = first_bit < 96 ? 0 : first_bit - 96;
		const uint8_t q = bits_left > 32 ? 32 : bits_left;

		assert(bits_left >= q);
		result.addr[3] = lrtr_get_bits(val->addr[3], fr, q);
	}
	return result;
}